

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl.h
# Opt level: O2

avl_iter_t * avl_iter(avl_node_t *node)

{
  avl_iter_t *paVar1;
  size_t __size;
  
  if (node == (avl_node_t *)0x0) {
    __size = 0x10;
  }
  else {
    __size = (ulong)(node->height + 1) * 8 + 8;
  }
  paVar1 = (avl_iter_t *)malloc(__size);
  paVar1->height = 0;
  paVar1[1].height = (size_t)node;
  return paVar1;
}

Assistant:

static inline avl_iter_t*
avl_iter(avl_node_t *node)
{
    size_t max = node ? node->height+1 : 1;
    avl_iter_t *result = (avl_iter_t*)malloc(sizeof(avl_iter_t) + sizeof(avl_node_t*) * max);
    result->height = 0;
    result->nodes[0] = node;
    return result;
}